

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

TPZCompMesh * __thiscall TPZMHMeshControl::CriaMalhaTemporaria(TPZMHMeshControl *this)

{
  bool bVar1;
  int dim_00;
  int iVar2;
  TPZGeoMesh *this_00;
  TPZGeoEl **ppTVar3;
  TPZGeoEl *pTVar4;
  TPZCompMesh *pTVar5;
  long *plVar6;
  reference piVar7;
  long in_RDI;
  TPZAutoPointer *this_01;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  int matid;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide gelside_1;
  int is_1;
  int ns_1;
  TPZGeoEl *gel_1;
  int64_t el_1;
  TPZCreateApproximationSpace *create;
  TPZBndCond *BCondD1;
  TPZVec<double> val2;
  TPZFMatrix<double> val1;
  TPZL2Projection<double> *material;
  TPZMaterialT<double> *meshmat;
  iterator it;
  int nstate;
  TPZManVector<double,_1> sol;
  TPZCompMesh *cmesh;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  int is;
  int ns;
  int materialid;
  TPZGeoEl *gel;
  int64_t el;
  int64_t nel;
  TPZGeoMesh *gmesh;
  set<int,_std::less<int>,_std::allocator<int>_> bcids;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  int dim;
  TPZGeoElSide *in_stack_fffffffffffffbc8;
  TPZVec<double> *in_stack_fffffffffffffbd0;
  TPZCompMesh *in_stack_fffffffffffffbd8;
  TPZCompMesh *in_stack_fffffffffffffbe0;
  iterator in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  TPZCompMesh *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  int64_t in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  TPZL2Projection<double> *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffcb4;
  undefined1 isComplex;
  iterator in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  _Self local_2f0;
  _Self local_2e8;
  int local_2dc;
  TPZGeoElSide local_2d8;
  TPZGeoElSide local_2c0;
  int local_2a8;
  int local_2a4;
  _Self local_2a0;
  _Self local_298;
  TPZGeoEl *local_290;
  long local_288;
  TPZCompMesh *local_280;
  _Base_ptr local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined1 local_238 [144];
  _Self local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  long *local_190;
  _Self local_188;
  long *local_180;
  _Self local_178;
  undefined4 local_16c;
  undefined8 local_168;
  TPZCompMesh *local_138;
  _Base_ptr local_118;
  undefined1 local_110;
  int local_104;
  TPZGeoElSide local_100;
  TPZGeoElSide local_e8;
  int local_d0;
  int local_cc;
  _Base_ptr local_c8;
  undefined1 local_c0;
  int local_b4;
  _Self local_b0;
  _Self local_a8;
  TPZGeoEl *local_a0;
  long local_98;
  long local_90;
  TPZGeoMesh *local_78;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  this_01 = (TPZAutoPointer *)(in_RDI + 8);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)this_01);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffbe0);
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)this_01);
  dim_00 = TPZGeoMesh::Dimension(this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e097d1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e097de);
  local_78 = ::TPZAutoPointer::operator_cast_to_TPZGeoMesh_(this_01);
  local_90 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e09812);
  for (local_98 = 0; isComplex = (undefined1)((uint)in_stack_fffffffffffffcb4 >> 0x18),
      local_98 < local_90; local_98 = local_98 + 1) {
    TPZGeoMesh::ElementVec(local_78);
    ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZGeoEl_*,_10> *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (int64_t)in_stack_fffffffffffffbe8._M_node);
    local_a0 = *ppTVar3;
    if (local_a0 != (TPZGeoEl *)0x0) {
      in_stack_fffffffffffffcc4 = (**(code **)(*(long *)local_a0 + 0x210))();
      in_stack_fffffffffffffcc0 = CONCAT13(1,(int3)in_stack_fffffffffffffcc0);
      if (in_stack_fffffffffffffcc4 == dim_00) {
        in_stack_fffffffffffffcb8 =
             std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
                  )in_stack_fffffffffffffbc8,(key_type_conflict1 *)0x1e09912);
        local_a8._M_node = in_stack_fffffffffffffcb8._M_node;
        local_b0._M_node =
             (_Base_ptr)
             std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             end((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                 in_stack_fffffffffffffbc8);
        bVar1 = std::operator==(&local_a8,&local_b0);
        in_stack_fffffffffffffcc0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcc0);
      }
      if ((char)((uint)in_stack_fffffffffffffcc0 >> 0x18) == '\0') {
        in_stack_fffffffffffffcb4 = TPZGeoEl::MaterialId(local_a0);
        local_b4 = in_stack_fffffffffffffcb4;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           (value_type_conflict4 *)in_stack_fffffffffffffbe8._M_node);
        local_c8 = (_Base_ptr)pVar8.first._M_node;
        local_c0 = pVar8.second;
        local_cc = (**(code **)(*(long *)local_a0 + 0xf0))();
        for (local_d0 = 0; local_d0 < local_cc; local_d0 = local_d0 + 1) {
          iVar2 = (**(code **)(*(long *)local_a0 + 0x208))(local_a0,local_d0);
          if (iVar2 == dim_00 + -1) {
            TPZGeoElSide::TPZGeoElSide
                      ((TPZGeoElSide *)in_stack_fffffffffffffbe0,
                       (TPZGeoEl *)in_stack_fffffffffffffbd8,
                       (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffbd8);
            while (iVar2 = TPZGeoElSide::operator!=(&local_100,&local_e8), iVar2 != 0) {
              pTVar4 = TPZGeoElSide::Element(&local_100);
              iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))();
              if (iVar2 == dim_00 + -1) {
                pTVar4 = TPZGeoElSide::Element(&local_100);
                local_104 = TPZGeoEl::MaterialId(pTVar4);
                pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                   (value_type_conflict4 *)in_stack_fffffffffffffbe8._M_node);
                local_118 = (_Base_ptr)pVar8.first._M_node;
                local_110 = pVar8.second;
              }
              TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffbd8);
              TPZGeoElSide::operator=
                        ((TPZGeoElSide *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e09c0e);
            }
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e09c20);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e09c2d);
          }
        }
      }
    }
  }
  pTVar5 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh
            ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (TPZAutoPointer<TPZGeoMesh> *)in_stack_fffffffffffffcb8._M_node,(bool)isComplex);
  local_138 = pTVar5;
  TPZCompMesh::SetDimModel(pTVar5,dim_00);
  local_168 = 0;
  TPZManVector<double,_1>::TPZManVector
            ((TPZManVector<double,_1> *)
             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             (int64_t)in_stack_fffffffffffffbf8,
             (double *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_16c = 1;
  local_178._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbc8);
  local_180 = (long *)0x0;
  while( true ) {
    local_188._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbc8);
    bVar1 = std::operator!=(&local_178,&local_188);
    if (!bVar1) break;
    plVar6 = (long *)operator_new(0xb0);
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1e09d6f);
    TPZL2Projection<double>::TPZL2Projection
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28,
               (int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
               (TPZVec<double> *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    local_190 = plVar6;
    TPZCompMesh::InsertMaterialObject
              (in_stack_fffffffffffffbf8,
               (TPZMaterial *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
    if (local_180 == (long *)0x0) {
      local_180 = local_190;
    }
    local_198 = (_Base_ptr)
                std::_Rb_tree_const_iterator<int>::operator++
                          ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  }
  if (local_180 == (long *)0x0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(dim_00,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  local_1a0 = (_Base_ptr)
              std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbc8
                        );
  local_178._M_node = local_1a0;
  while( true ) {
    local_1a8._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbc8);
    bVar1 = std::operator!=(&local_178,&local_1a8);
    if (!bVar1) break;
    local_240 = 0;
    TPZFMatrix<double>::TPZFMatrix
              ((TPZFMatrix<double> *)in_stack_fffffffffffffc30,
               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
               in_stack_fffffffffffffc20,
               (double *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    local_268 = 0;
    TPZVec<double>::TPZVec
              ((TPZVec<double> *)in_stack_fffffffffffffbe0,(int64_t)in_stack_fffffffffffffbd8,
               (double *)in_stack_fffffffffffffbd0);
    plVar6 = local_180;
    piVar7 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x1e09f51)
    ;
    local_270 = (**(code **)(*plVar6 + 0xb8))(plVar6,plVar6,*piVar7,0,local_238,local_260);
    TPZCompMesh::InsertMaterialObject
              (in_stack_fffffffffffffbe0,(TPZBndCond *)in_stack_fffffffffffffbd8);
    local_278 = (_Base_ptr)
                std::_Rb_tree_const_iterator<int>::operator++
                          ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    TPZVec<double>::~TPZVec(in_stack_fffffffffffffbd0);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1e09fde);
  }
  TPZCompMesh::SetAllCreateFunctionsDiscontinuous((TPZCompMesh *)0x1e0a039);
  local_280 = (TPZCompMesh *)TPZCompMesh::ApproxSpace(local_138);
  for (local_288 = 0; local_288 < local_90; local_288 = local_288 + 1) {
    TPZGeoMesh::ElementVec(local_78);
    ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZGeoEl_*,_10> *)
                         CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         (int64_t)in_stack_fffffffffffffbe8._M_node);
    local_290 = *ppTVar3;
    if (local_290 != (TPZGeoEl *)0x0) {
      iVar2 = (**(code **)(*(long *)local_290 + 0x210))();
      bVar1 = true;
      if (iVar2 == dim_00) {
        local_298._M_node =
             (_Base_ptr)
             std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
                  )in_stack_fffffffffffffbc8,(key_type_conflict1 *)0x1e0a114);
        local_2a0._M_node =
             (_Base_ptr)
             std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             end((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                 in_stack_fffffffffffffbc8);
        bVar1 = std::operator==(&local_298,&local_2a0);
      }
      if (bVar1 == false) {
        TPZCreateApproximationSpace::CreateCompEl
                  ((TPZCreateApproximationSpace *)in_stack_fffffffffffffbe8._M_node,
                   (TPZGeoEl *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        local_2a4 = (**(code **)(*(long *)local_290 + 0xf0))();
        for (local_2a8 = 0; local_2a8 < local_2a4; local_2a8 = local_2a8 + 1) {
          iVar2 = (**(code **)(*(long *)local_290 + 0x208))(local_290,local_2a8);
          if (iVar2 == dim_00 + -1) {
            TPZGeoElSide::TPZGeoElSide
                      ((TPZGeoElSide *)in_stack_fffffffffffffbe0,
                       (TPZGeoEl *)in_stack_fffffffffffffbd8,
                       (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffbd8);
            while (iVar2 = TPZGeoElSide::operator!=(&local_2d8,&local_2c0), iVar2 != 0) {
              pTVar4 = TPZGeoElSide::Element(&local_2d8);
              iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))();
              if (iVar2 == dim_00 + -1) {
                pTVar4 = TPZGeoElSide::Element(&local_2d8);
                in_stack_fffffffffffffbf4 = TPZGeoEl::MaterialId(pTVar4);
                local_2dc = in_stack_fffffffffffffbf4;
                in_stack_fffffffffffffbe8 =
                     std::set<int,_std::less<int>,_std::allocator<int>_>::find
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                in_stack_fffffffffffffbd8,(key_type *)in_stack_fffffffffffffbd0);
                local_2e8._M_node = in_stack_fffffffffffffbe8._M_node;
                local_2f0._M_node =
                     (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::end
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                in_stack_fffffffffffffbc8);
                bVar1 = std::operator!=(&local_2e8,&local_2f0);
                if (bVar1) {
                  in_stack_fffffffffffffbd8 = local_280;
                  in_stack_fffffffffffffbe0 = (TPZCompMesh *)TPZGeoElSide::Element(&local_2d8);
                  TPZCreateApproximationSpace::CreateCompEl
                            ((TPZCreateApproximationSpace *)in_stack_fffffffffffffbe8._M_node,
                             (TPZGeoEl *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
                }
              }
              TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffbd8);
              TPZGeoElSide::operator=
                        ((TPZGeoElSide *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0a3e2);
            }
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0a3f4);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0a401);
          }
        }
      }
    }
  }
  TPZCreateApproximationSpace::CreateInterfaces
            ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  (**(code **)(*(long *)local_138 + 0x60))();
  pTVar5 = local_138;
  TPZManVector<double,_1>::~TPZManVector((TPZManVector<double,_1> *)local_138);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e0a48a);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1e0a497);
  return pTVar5;
}

Assistant:

TPZCompMesh* TPZMHMeshControl::CriaMalhaTemporaria()
{
    fGMesh->ResetReference();
	/// criar materiais
	int dim = fGMesh->Dimension();
    std::set<int> matids, bcids;
    TPZGeoMesh &gmesh = fGMesh;
    int64_t nel = gmesh.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        int materialid = gel->MaterialId();
        matids.insert(materialid);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    bcids.insert(neighbour.Element()->MaterialId());
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCompMesh *cmesh = new TPZCompMesh(fGMesh);
	cmesh->SetDimModel(dim);
    TPZManVector<STATE,1> sol(1,0.);
    int nstate = 1;
    std::set<int>::iterator it = matids.begin();
    TPZMaterialT<STATE> *meshmat = nullptr;
    while (it != matids.end()) {
        TPZL2Projection<STATE> *material = new TPZL2Projection(*it,dim,nstate,sol);
        cmesh->InsertMaterialObject(material);
        if (!meshmat) {
            meshmat = material;
        }
        it++;

    }

    if (!meshmat) {
        DebugStop();
    }

	it = bcids.begin();
    while (it != bcids.end()) {
        ///Inserir condicao de contorno
        TPZFMatrix<STATE> val1(2,2,0.);
        TPZVec<STATE> val2(2,0.);

        TPZBndCond * BCondD1 = meshmat->CreateBC(meshmat, *it,0, val1, val2);
        cmesh->InsertMaterialObject(BCondD1);

        it++;
    }

    cmesh->SetAllCreateFunctionsDiscontinuous();
    TPZCreateApproximationSpace &create = cmesh->ApproxSpace();

    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        create.CreateCompEl(gel, *cmesh);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    int matid = neighbour.Element()->MaterialId();
                    if (bcids.find(matid) != bcids.end()) {
                        create.CreateCompEl(neighbour.Element(), *cmesh);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCreateApproximationSpace::CreateInterfaces(*cmesh);
    cmesh->ExpandSolution();
    return cmesh;
}